

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::QuadMvIntersectorKMoeller<4,_4,_false>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  uint uVar1;
  BVH *bvh;
  NodeRef root;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  size_t k;
  byte bVar7;
  byte bVar8;
  int iVar10;
  ushort uVar11;
  ulong uVar12;
  NodeRef *pNVar13;
  long lVar14;
  ulong uVar15;
  byte bVar16;
  ushort uVar17;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar18;
  undefined4 uVar19;
  uint uVar20;
  bool bVar21;
  ulong uVar22;
  ulong uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar44;
  vint4 ai_2;
  vint4 bi;
  vint4 bi_1;
  undefined1 in_ZMM2 [64];
  vint4 bi_3;
  vint4 ai;
  vint4 bi_2;
  vint4 ai_1;
  vint4 ai_3;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [64];
  undefined1 auVar48 [16];
  undefined1 auVar49 [64];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  Precalculations pre;
  TravRayK<4,_false> tray;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  ushort uVar9;
  
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar26 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
    auVar29 = ZEXT816(0) << 0x40;
    uVar5 = vcmpps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar29,5);
    uVar22 = vpcmpeqd_avx512vl(auVar26,(undefined1  [16])valid_i->field_0);
    uVar22 = ((byte)uVar5 & 0xf) & uVar22;
    bVar8 = (byte)uVar22;
    if (bVar8 != 0) {
      tray.org.field_0._0_4_ = *(undefined4 *)ray;
      tray.org.field_0._4_4_ = *(undefined4 *)(ray + 4);
      tray.org.field_0._8_4_ = *(undefined4 *)(ray + 8);
      tray.org.field_0._12_4_ = *(undefined4 *)(ray + 0xc);
      tray.org.field_0._16_4_ = *(undefined4 *)(ray + 0x10);
      tray.org.field_0._20_4_ = *(undefined4 *)(ray + 0x14);
      tray.org.field_0._24_4_ = *(undefined4 *)(ray + 0x18);
      tray.org.field_0._28_4_ = *(undefined4 *)(ray + 0x1c);
      tray.org.field_0._32_4_ = *(undefined4 *)(ray + 0x20);
      tray.org.field_0._36_4_ = *(undefined4 *)(ray + 0x24);
      tray.org.field_0._40_4_ = *(undefined4 *)(ray + 0x28);
      tray.org.field_0._44_4_ = *(undefined4 *)(ray + 0x2c);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar28._8_4_ = 0x7fffffff;
      auVar28._0_8_ = 0x7fffffff7fffffff;
      auVar28._12_4_ = 0x7fffffff;
      auVar26 = vandps_avx(auVar28,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar24._8_4_ = 0x219392ef;
      auVar24._0_8_ = 0x219392ef219392ef;
      auVar24._12_4_ = 0x219392ef;
      uVar12 = vcmpps_avx512vl(auVar26,auVar24,1);
      bVar21 = (bool)((byte)uVar12 & 1);
      auVar25._0_4_ = (uint)bVar21 * 0x219392ef | (uint)!bVar21 * tray.dir.field_0._0_4_;
      bVar21 = (bool)((byte)(uVar12 >> 1) & 1);
      auVar25._4_4_ = (uint)bVar21 * 0x219392ef | (uint)!bVar21 * tray.dir.field_0._4_4_;
      bVar21 = (bool)((byte)(uVar12 >> 2) & 1);
      auVar25._8_4_ = (uint)bVar21 * 0x219392ef | (uint)!bVar21 * tray.dir.field_0._8_4_;
      bVar21 = (bool)((byte)(uVar12 >> 3) & 1);
      auVar25._12_4_ = (uint)bVar21 * 0x219392ef | (uint)!bVar21 * tray.dir.field_0._12_4_;
      auVar26 = vandps_avx(auVar28,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      uVar12 = vcmpps_avx512vl(auVar26,auVar24,1);
      bVar21 = (bool)((byte)uVar12 & 1);
      auVar30._0_4_ = (uint)bVar21 * 0x219392ef | (uint)!bVar21 * tray.dir.field_0._16_4_;
      bVar21 = (bool)((byte)(uVar12 >> 1) & 1);
      auVar30._4_4_ = (uint)bVar21 * 0x219392ef | (uint)!bVar21 * tray.dir.field_0._20_4_;
      bVar21 = (bool)((byte)(uVar12 >> 2) & 1);
      auVar30._8_4_ = (uint)bVar21 * 0x219392ef | (uint)!bVar21 * tray.dir.field_0._24_4_;
      bVar21 = (bool)((byte)(uVar12 >> 3) & 1);
      auVar30._12_4_ = (uint)bVar21 * 0x219392ef | (uint)!bVar21 * tray.dir.field_0._28_4_;
      auVar26 = vandps_avx(auVar28,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      uVar12 = vcmpps_avx512vl(auVar26,auVar24,1);
      bVar21 = (bool)((byte)uVar12 & 1);
      auVar31._0_4_ = (uint)bVar21 * 0x219392ef | (uint)!bVar21 * tray.dir.field_0._32_4_;
      bVar21 = (bool)((byte)(uVar12 >> 1) & 1);
      auVar31._4_4_ = (uint)bVar21 * 0x219392ef | (uint)!bVar21 * tray.dir.field_0._36_4_;
      bVar21 = (bool)((byte)(uVar12 >> 2) & 1);
      auVar31._8_4_ = (uint)bVar21 * 0x219392ef | (uint)!bVar21 * tray.dir.field_0._40_4_;
      bVar21 = (bool)((byte)(uVar12 >> 3) & 1);
      auVar31._12_4_ = (uint)bVar21 * 0x219392ef | (uint)!bVar21 * tray.dir.field_0._44_4_;
      auVar24 = vrcp14ps_avx512vl(auVar25);
      auVar27._8_4_ = 0x3f800000;
      auVar27._0_8_ = &DAT_3f8000003f800000;
      auVar27._12_4_ = 0x3f800000;
      auVar26 = vfnmadd213ps_fma(auVar25,auVar24,auVar27);
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar26,auVar24,auVar24)
      ;
      auVar25 = vrcp14ps_avx512vl(auVar30);
      auVar26 = vfnmadd213ps_fma(auVar30,auVar25,auVar27);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar26,auVar25,auVar25)
      ;
      auVar25 = vrcp14ps_avx512vl(auVar31);
      auVar26 = vfnmadd213ps_fma(auVar31,auVar25,auVar27);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar26,auVar25,auVar25)
      ;
      tray.org_rdir.field_0._0_4_ = (float)tray.org.field_0._0_4_ * tray.rdir.field_0._0_4_;
      tray.org_rdir.field_0._4_4_ = (float)tray.org.field_0._4_4_ * tray.rdir.field_0._4_4_;
      tray.org_rdir.field_0._8_4_ = (float)tray.org.field_0._8_4_ * tray.rdir.field_0._8_4_;
      tray.org_rdir.field_0._12_4_ = (float)tray.org.field_0._12_4_ * tray.rdir.field_0._12_4_;
      uVar12 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar29,1);
      auVar26 = vpbroadcastd_avx512vl(ZEXT416(0x10));
      tray.nearXYZ.field_0._4_4_ = (uint)((byte)(uVar12 >> 1) & 1) * auVar26._4_4_;
      tray.nearXYZ.field_0._0_4_ = (uint)((byte)uVar12 & 1) * auVar26._0_4_;
      tray.nearXYZ.field_0._8_4_ = (uint)((byte)(uVar12 >> 2) & 1) * auVar26._8_4_;
      tray.nearXYZ.field_0._12_4_ = (uint)((byte)(uVar12 >> 3) & 1) * auVar26._12_4_;
      uVar12 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar29,5);
      auVar26 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      bVar21 = (bool)((byte)uVar12 & 1);
      tray.nearXYZ.field_0._16_4_ = (uint)bVar21 * auVar26._0_4_ | (uint)!bVar21 * 0x30;
      bVar21 = (bool)((byte)(uVar12 >> 1) & 1);
      tray.nearXYZ.field_0._20_4_ = (uint)bVar21 * auVar26._4_4_ | (uint)!bVar21 * 0x30;
      bVar21 = (bool)((byte)(uVar12 >> 2) & 1);
      tray.nearXYZ.field_0._24_4_ = (uint)bVar21 * auVar26._8_4_ | (uint)!bVar21 * 0x30;
      bVar21 = (bool)((byte)(uVar12 >> 3) & 1);
      tray.nearXYZ.field_0._28_4_ = (uint)bVar21 * auVar26._12_4_ | (uint)!bVar21 * 0x30;
      uVar12 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar29,5);
      auVar26 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar21 = (bool)((byte)uVar12 & 1);
      tray.nearXYZ.field_0._32_4_ = (uint)bVar21 * auVar26._0_4_ | (uint)!bVar21 * 0x50;
      bVar21 = (bool)((byte)(uVar12 >> 1) & 1);
      tray.nearXYZ.field_0._36_4_ = (uint)bVar21 * auVar26._4_4_ | (uint)!bVar21 * 0x50;
      bVar21 = (bool)((byte)(uVar12 >> 2) & 1);
      tray.nearXYZ.field_0._40_4_ = (uint)bVar21 * auVar26._8_4_ | (uint)!bVar21 * 0x50;
      bVar21 = (bool)((byte)(uVar12 >> 3) & 1);
      tray.nearXYZ.field_0._44_4_ = (uint)bVar21 * auVar26._12_4_ | (uint)!bVar21 * 0x50;
      tray.org_rdir.field_0._16_4_ = (float)tray.org.field_0._16_4_ * tray.rdir.field_0._16_4_;
      tray.org_rdir.field_0._20_4_ = (float)tray.org.field_0._20_4_ * tray.rdir.field_0._20_4_;
      tray.org_rdir.field_0._24_4_ = (float)tray.org.field_0._24_4_ * tray.rdir.field_0._24_4_;
      tray.org_rdir.field_0._28_4_ = (float)tray.org.field_0._28_4_ * tray.rdir.field_0._28_4_;
      tray.org_rdir.field_0._32_4_ = (float)tray.org.field_0._32_4_ * tray.rdir.field_0._32_4_;
      tray.org_rdir.field_0._36_4_ = (float)tray.org.field_0._36_4_ * tray.rdir.field_0._36_4_;
      tray.org_rdir.field_0._40_4_ = (float)tray.org.field_0._40_4_ * tray.rdir.field_0._40_4_;
      tray.org_rdir.field_0._44_4_ = (float)tray.org.field_0._44_4_ * tray.rdir.field_0._44_4_;
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar47 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      auVar26 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x30),auVar29);
      tray.tnear.field_0._0_4_ =
           (uint)(bVar8 & 1) * auVar26._0_4_ | (uint)!(bool)(bVar8 & 1) * 0x7f800000;
      bVar21 = (bool)((byte)(uVar22 >> 1) & 1);
      tray.tnear.field_0._4_4_ = (uint)bVar21 * auVar26._4_4_ | (uint)!bVar21 * 0x7f800000;
      bVar21 = (bool)((byte)(uVar22 >> 2) & 1);
      tray.tnear.field_0._8_4_ = (uint)bVar21 * auVar26._8_4_ | (uint)!bVar21 * 0x7f800000;
      bVar21 = SUB81(uVar22 >> 3,0);
      tray.tnear.field_0._12_4_ = (uint)bVar21 * auVar26._12_4_ | (uint)!bVar21 * 0x7f800000;
      auVar26 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar29);
      tray.tfar.field_0.i[0] =
           (uint)(bVar8 & 1) * auVar26._0_4_ | (uint)!(bool)(bVar8 & 1) * -0x800000;
      bVar21 = (bool)((byte)(uVar22 >> 1) & 1);
      tray.tfar.field_0.i[1] = (uint)bVar21 * auVar26._4_4_ | (uint)!bVar21 * -0x800000;
      bVar21 = (bool)((byte)(uVar22 >> 2) & 1);
      tray.tfar.field_0.i[2] = (uint)bVar21 * auVar26._8_4_ | (uint)!bVar21 * -0x800000;
      bVar21 = SUB81(uVar22 >> 3,0);
      tray.tfar.field_0.i[3] = (uint)bVar21 * auVar26._12_4_ | (uint)!bVar21 * -0x800000;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar20 = 3;
      }
      else {
        uVar20 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      uVar11 = (ushort)uVar22 ^ 0xf;
      pNVar13 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar18 = &stack_near[2].field_0;
      stack_node[1].ptr = (bvh->root).ptr;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
LAB_0073bac1:
      paVar18 = paVar18 + -1;
      root.ptr = pNVar13[-1].ptr;
      pNVar13 = pNVar13 + -1;
      if (root.ptr == 0xfffffffffffffff8) {
        iVar10 = 3;
      }
      else {
        aVar44 = *paVar18;
        uVar22 = vcmpps_avx512vl((undefined1  [16])aVar44,(undefined1  [16])tray.tfar.field_0,1);
        if ((char)uVar22 == '\0') {
          iVar10 = 2;
        }
        else {
          uVar19 = (undefined4)uVar22;
          iVar10 = 0;
          if ((uint)POPCOUNT(uVar19) <= uVar20) {
            do {
              k = 0;
              for (uVar12 = uVar22; (uVar12 & 1) == 0; uVar12 = uVar12 >> 1 | 0x8000000000000000) {
                k = k + 1;
              }
              bVar21 = occluded1(This,bvh,root,k,&pre,ray,&tray,context);
              bVar7 = (byte)(1 << ((uint)k & 0x1f));
              if (!bVar21) {
                bVar7 = 0;
              }
              bVar7 = (byte)uVar11 | bVar7;
              uVar11 = (ushort)bVar7;
              uVar22 = uVar22 - 1 & uVar22;
            } while (uVar22 != 0);
            if (bVar7 == 0xf) {
              iVar10 = 3;
            }
            else {
              auVar26 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
              tray.tfar.field_0.i[0] =
                   (uint)(bVar7 & 1) * auVar26._0_4_ |
                   (uint)!(bool)(bVar7 & 1) * tray.tfar.field_0.i[0];
              bVar21 = (bool)(bVar7 >> 1 & 1);
              tray.tfar.field_0.i[1] =
                   (uint)bVar21 * auVar26._4_4_ | (uint)!bVar21 * tray.tfar.field_0.i[1];
              bVar21 = (bool)(bVar7 >> 2 & 1);
              tray.tfar.field_0.i[2] =
                   (uint)bVar21 * auVar26._8_4_ | (uint)!bVar21 * tray.tfar.field_0.i[2];
              bVar21 = (bool)(bVar7 >> 3 & 1);
              tray.tfar.field_0.i[3] =
                   (uint)bVar21 * auVar26._12_4_ | (uint)!bVar21 * tray.tfar.field_0.i[3];
              iVar10 = 2;
            }
            auVar47 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          }
          if (uVar20 < (uint)POPCOUNT(uVar19)) {
            do {
              if ((root.ptr & 8) != 0) {
                if (root.ptr == 0xfffffffffffffff8) goto LAB_0073c1b4;
                uVar5 = vcmpps_avx512vl((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar44
                                        ,6);
                if ((char)uVar5 != '\0') {
                  uVar22 = (ulong)((uint)root.ptr & 0xf);
                  bVar7 = (byte)(uVar11 & 0xff0f);
                  if (uVar22 == 8) goto LAB_0073c1a7;
                  uVar9 = uVar11 & 0xff0f ^ 0xf;
                  auVar26 = *(undefined1 (*) [16])(ray + 0x50);
                  auVar29 = *(undefined1 (*) [16])(ray + 0x60);
                  auVar25 = *(undefined1 (*) [16])(ray + 0x40);
                  lVar14 = (root.ptr & 0xfffffffffffffff0) + 0xc0;
                  uVar12 = 0;
                  goto LAB_0073bd2e;
                }
                iVar10 = 2;
                break;
              }
              auVar49 = ZEXT1664(auVar47._0_16_);
              uVar22 = 0;
              uVar12 = 8;
              do {
                uVar15 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + uVar22 * 8);
                if (uVar15 != 8) {
                  uVar19 = *(undefined4 *)(root.ptr + 0x20 + uVar22 * 4);
                  auVar42._4_4_ = uVar19;
                  auVar42._0_4_ = uVar19;
                  auVar42._8_4_ = uVar19;
                  auVar42._12_4_ = uVar19;
                  auVar25 = vfmsub132ps_fma(auVar42,(undefined1  [16])
                                                    tray.org_rdir.field_0.field_0.x.field_0,
                                            (undefined1  [16])tray.rdir.field_0.field_0.x.field_0);
                  auVar39._4_4_ = tray.org_rdir.field_0._20_4_;
                  auVar39._0_4_ = tray.org_rdir.field_0._16_4_;
                  auVar39._8_4_ = tray.org_rdir.field_0._24_4_;
                  auVar39._12_4_ = tray.org_rdir.field_0._28_4_;
                  uVar19 = *(undefined4 *)(root.ptr + 0x40 + uVar22 * 4);
                  auVar43._4_4_ = uVar19;
                  auVar43._0_4_ = uVar19;
                  auVar43._8_4_ = uVar19;
                  auVar43._12_4_ = uVar19;
                  auVar41._4_4_ = tray.org_rdir.field_0._36_4_;
                  auVar41._0_4_ = tray.org_rdir.field_0._32_4_;
                  auVar41._8_4_ = tray.org_rdir.field_0._40_4_;
                  auVar41._12_4_ = tray.org_rdir.field_0._44_4_;
                  uVar19 = *(undefined4 *)(root.ptr + 0x60 + uVar22 * 4);
                  auVar45._4_4_ = uVar19;
                  auVar45._0_4_ = uVar19;
                  auVar45._8_4_ = uVar19;
                  auVar45._12_4_ = uVar19;
                  auVar30 = vfmsub132ps_fma(auVar43,auVar39,
                                            (undefined1  [16])tray.rdir.field_0.field_0.y.field_0);
                  auVar31 = vfmsub132ps_fma(auVar45,auVar41,
                                            (undefined1  [16])tray.rdir.field_0.field_0.z.field_0);
                  uVar19 = *(undefined4 *)(root.ptr + 0x30 + uVar22 * 4);
                  auVar26._4_4_ = uVar19;
                  auVar26._0_4_ = uVar19;
                  auVar26._8_4_ = uVar19;
                  auVar26._12_4_ = uVar19;
                  auVar24 = vfmsub132ps_avx512vl
                                      ((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,
                                       (undefined1  [16])tray.org_rdir.field_0.field_0.x.field_0,
                                       auVar26);
                  uVar19 = *(undefined4 *)(root.ptr + 0x50 + uVar22 * 4);
                  auVar29._4_4_ = uVar19;
                  auVar29._0_4_ = uVar19;
                  auVar29._8_4_ = uVar19;
                  auVar29._12_4_ = uVar19;
                  auVar27 = vfmsub132ps_avx512vl
                                      ((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar39
                                       ,auVar29);
                  uVar19 = *(undefined4 *)(root.ptr + 0x70 + uVar22 * 4);
                  auVar38._4_4_ = uVar19;
                  auVar38._0_4_ = uVar19;
                  auVar38._8_4_ = uVar19;
                  auVar38._12_4_ = uVar19;
                  auVar28 = vfmsub132ps_avx512vl
                                      ((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar41
                                       ,auVar38);
                  auVar26 = vpminsd_avx(auVar25,auVar24);
                  auVar29 = vpminsd_avx(auVar30,auVar27);
                  auVar26 = vpmaxsd_avx(auVar26,auVar29);
                  auVar29 = vpminsd_avx(auVar31,auVar28);
                  auVar26 = vpmaxsd_avx(auVar26,auVar29);
                  auVar29 = vpmaxsd_avx(auVar25,auVar24);
                  auVar25 = vpmaxsd_avx(auVar30,auVar27);
                  auVar25 = vpminsd_avx(auVar29,auVar25);
                  auVar29 = vpmaxsd_avx(auVar31,auVar28);
                  auVar25 = vpminsd_avx(auVar25,auVar29);
                  auVar29 = vpmaxsd_avx(auVar26,(undefined1  [16])tray.tnear.field_0);
                  auVar25 = vpminsd_avx(auVar25,(undefined1  [16])tray.tfar.field_0);
                  uVar23 = vpcmpd_avx512vl(auVar29,auVar25,2);
                  uVar23 = uVar23 & 0xf;
                  if ((byte)uVar23 != 0) {
                    auVar29 = vblendmps_avx512vl(auVar47._0_16_,auVar26);
                    bVar21 = (bool)((byte)uVar23 & 1);
                    bVar2 = (bool)((byte)(uVar23 >> 1) & 1);
                    bVar3 = (bool)((byte)(uVar23 >> 2) & 1);
                    bVar4 = SUB81(uVar23 >> 3,0);
                    if (uVar12 != 8) {
                      pNVar13->ptr = uVar12;
                      pNVar13 = pNVar13 + 1;
                      *paVar18 = auVar49._0_16_;
                      paVar18 = paVar18 + 1;
                    }
                    auVar49 = ZEXT1664(CONCAT412((uint)bVar4 * auVar29._12_4_ |
                                                 (uint)!bVar4 * auVar26._12_4_,
                                                 CONCAT48((uint)bVar3 * auVar29._8_4_ |
                                                          (uint)!bVar3 * auVar26._8_4_,
                                                          CONCAT44((uint)bVar2 * auVar29._4_4_ |
                                                                   (uint)!bVar2 * auVar26._4_4_,
                                                                   (uint)bVar21 * auVar29._0_4_ |
                                                                   (uint)!bVar21 * auVar26._0_4_))))
                    ;
                    uVar12 = uVar15;
                  }
                }
                aVar44 = auVar49._0_16_;
              } while ((uVar15 != 8) && (bVar21 = uVar22 < 3, uVar22 = uVar22 + 1, bVar21));
              iVar10 = 0;
              if (uVar12 == 8) {
LAB_0073bc8f:
                bVar21 = false;
                iVar10 = 4;
              }
              else {
                uVar5 = vcmpps_avx512vl((undefined1  [16])aVar44,(undefined1  [16])tray.tfar.field_0
                                        ,9);
                bVar21 = true;
                if ((uint)POPCOUNT((int)uVar5) <= uVar20) {
                  pNVar13->ptr = uVar12;
                  pNVar13 = pNVar13 + 1;
                  *paVar18 = aVar44;
                  paVar18 = paVar18 + 1;
                  goto LAB_0073bc8f;
                }
              }
              root.ptr = uVar12;
            } while (bVar21);
          }
        }
      }
      goto LAB_0073c1d5;
    }
  }
  return;
  while( true ) {
    uVar12 = uVar12 + 1;
    lVar14 = lVar14 + 0xe0;
    if (uVar22 - 8 <= uVar12) break;
LAB_0073bd2e:
    uVar15 = 0;
    uVar17 = uVar9;
    while( true ) {
      bVar7 = (byte)uVar17;
      uVar23 = (ulong)*(uint *)(lVar14 + uVar15 * 4);
      if (uVar23 == 0xffffffff) break;
      auVar30 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar14 + -0xc0 + uVar15 * 4)));
      auVar31 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar14 + -0xb0 + uVar15 * 4)));
      auVar24 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar14 + -0xa0 + uVar15 * 4)));
      uVar19 = *(undefined4 *)(lVar14 + -0x90 + uVar15 * 4);
      auVar46._4_4_ = uVar19;
      auVar46._0_4_ = uVar19;
      auVar46._8_4_ = uVar19;
      auVar46._12_4_ = uVar19;
      uVar19 = *(undefined4 *)(lVar14 + -0x80 + uVar15 * 4);
      auVar48._4_4_ = uVar19;
      auVar48._0_4_ = uVar19;
      auVar48._8_4_ = uVar19;
      auVar48._12_4_ = uVar19;
      uVar19 = *(undefined4 *)(lVar14 + -0x70 + uVar15 * 4);
      auVar50._4_4_ = uVar19;
      auVar50._0_4_ = uVar19;
      auVar50._8_4_ = uVar19;
      auVar50._12_4_ = uVar19;
      uVar19 = *(undefined4 *)(lVar14 + -0x30 + uVar15 * 4);
      auVar51._4_4_ = uVar19;
      auVar51._0_4_ = uVar19;
      auVar51._8_4_ = uVar19;
      auVar51._12_4_ = uVar19;
      uVar19 = *(undefined4 *)(lVar14 + -0x20 + uVar15 * 4);
      auVar53._4_4_ = uVar19;
      auVar53._0_4_ = uVar19;
      auVar53._8_4_ = uVar19;
      auVar53._12_4_ = uVar19;
      uVar19 = *(undefined4 *)(lVar14 + -0x10 + uVar15 * 4);
      auVar54._4_4_ = uVar19;
      auVar54._0_4_ = uVar19;
      auVar54._8_4_ = uVar19;
      auVar54._12_4_ = uVar19;
      auVar27 = vsubss_avx512f(auVar30,auVar46);
      auVar28 = vbroadcastss_avx512vl(auVar27);
      auVar32 = vsubss_avx512f(auVar31,auVar48);
      auVar33 = vbroadcastss_avx512vl(auVar32);
      auVar34 = vsubss_avx512f(auVar24,auVar50);
      auVar35 = vbroadcastss_avx512vl(auVar34);
      auVar36 = vsubss_avx512f(auVar51,auVar30);
      auVar37 = vbroadcastss_avx512vl(auVar36);
      auVar38 = vsubss_avx512f(auVar53,auVar31);
      auVar39 = vbroadcastss_avx512vl(auVar38);
      auVar40 = vsubss_avx512f(auVar54,auVar24);
      auVar41 = vbroadcastss_avx512vl(auVar40);
      auVar32 = vmulss_avx512f(auVar32,auVar40);
      auVar32 = vbroadcastss_avx512vl(auVar32);
      auVar40 = vfmsub231ps_avx512vl(auVar32,auVar39,auVar35);
      auVar32 = vmulss_avx512f(auVar34,auVar36);
      auVar32 = vbroadcastss_avx512vl(auVar32);
      auVar34 = vfmsub231ps_avx512vl(auVar32,auVar41,auVar28);
      auVar27 = vmulss_avx512f(auVar27,auVar38);
      auVar27 = vbroadcastss_avx512vl(auVar27);
      auVar27 = vfmsub231ps_avx512vl(auVar27,auVar37,auVar33);
      auVar30 = vsubps_avx512vl(auVar30,*(undefined1 (*) [16])ray);
      auVar31 = vsubps_avx512vl(auVar31,*(undefined1 (*) [16])(ray + 0x10));
      auVar24 = vsubps_avx512vl(auVar24,*(undefined1 (*) [16])(ray + 0x20));
      auVar32 = vmulps_avx512vl(auVar26,auVar24);
      auVar36 = vfmsub231ps_avx512vl(auVar32,auVar31,auVar29);
      auVar32 = vmulps_avx512vl(auVar29,auVar30);
      auVar38 = vfmsub231ps_avx512vl(auVar32,auVar24,auVar25);
      auVar32 = vmulps_avx512vl(auVar25,auVar31);
      auVar42 = vfmsub231ps_avx512vl(auVar32,auVar30,auVar26);
      auVar32 = vmulps_avx512vl(auVar27,auVar29);
      auVar32 = vfmadd231ps_avx512vl(auVar32,auVar34,auVar26);
      auVar43 = vfmadd231ps_avx512vl(auVar32,auVar40,auVar25);
      auVar32._8_4_ = 0x80000000;
      auVar32._0_8_ = 0x8000000080000000;
      auVar32._12_4_ = 0x80000000;
      auVar32 = vandps_avx512vl(auVar43,auVar32);
      auVar41 = vmulps_avx512vl(auVar41,auVar42);
      auVar39 = vfmadd231ps_avx512vl(auVar41,auVar38,auVar39);
      auVar37 = vfmadd231ps_avx512vl(auVar39,auVar36,auVar37);
      auVar37 = vxorps_avx512vl(auVar32,auVar37);
      uVar5 = vcmpps_avx512vl(auVar37,_DAT_01feba10,5);
      bVar16 = (byte)uVar5 & bVar7;
      if (bVar16 != 0) {
        auVar35 = vmulps_avx512vl(auVar35,auVar42);
        auVar33 = vfmadd213ps_avx512vl(auVar33,auVar38,auVar35);
        auVar28 = vfmadd213ps_avx512vl(auVar28,auVar36,auVar33);
        auVar28 = vxorps_avx512vl(auVar32,auVar28);
        uVar5 = vcmpps_avx512vl(auVar28,_DAT_01feba10,5);
        bVar16 = bVar16 & (byte)uVar5;
        if (bVar16 != 0) {
          auVar33._8_4_ = 0x7fffffff;
          auVar33._0_8_ = 0x7fffffff7fffffff;
          auVar33._12_4_ = 0x7fffffff;
          auVar33 = vandps_avx512vl(auVar43,auVar33);
          auVar35 = vsubps_avx512vl(auVar33,auVar37);
          uVar5 = vcmpps_avx512vl(auVar35,auVar28,5);
          bVar16 = bVar16 & (byte)uVar5;
          if (bVar16 != 0) {
            auVar24 = vmulps_avx512vl(auVar27,auVar24);
            auVar31 = vfmadd213ps_avx512vl(auVar31,auVar34,auVar24);
            auVar30 = vfmadd213ps_avx512vl(auVar30,auVar40,auVar31);
            auVar30 = vxorps_avx512vl(auVar32,auVar30);
            auVar31 = vmulps_avx512vl(auVar33,*(undefined1 (*) [16])(ray + 0x30));
            auVar24 = vmulps_avx512vl(auVar33,*(undefined1 (*) [16])(ray + 0x80));
            uVar5 = vcmpps_avx512vl(auVar30,auVar24,2);
            uVar6 = vcmpps_avx512vl(auVar31,auVar30,1);
            bVar16 = bVar16 & (byte)uVar5 & (byte)uVar6;
            if (bVar16 != 0) {
              uVar5 = vcmpps_avx512vl(auVar43,_DAT_01feba10,4);
              bVar16 = bVar16 & (byte)uVar5;
              if (bVar16 != 0) {
                uVar1 = ((context->scene->geometries).items[uVar23].ptr)->mask;
                auVar34._4_4_ = uVar1;
                auVar34._0_4_ = uVar1;
                auVar34._8_4_ = uVar1;
                auVar34._12_4_ = uVar1;
                uVar5 = vptestmd_avx512vl(*(undefined1 (*) [16])(ray + 0x90),auVar34);
                bVar16 = bVar16 & (byte)uVar5 & 0xf;
                if (bVar16 != 0) {
                  uVar17 = (ushort)((bVar16 ^ 0xf) & bVar7);
                }
              }
            }
          }
        }
      }
      bVar7 = (byte)uVar17;
      if (bVar7 == 0) {
        bVar21 = false;
      }
      else {
        uVar19 = *(undefined4 *)(lVar14 + -0x60 + uVar15 * 4);
        auVar40._4_4_ = uVar19;
        auVar40._0_4_ = uVar19;
        auVar40._8_4_ = uVar19;
        auVar40._12_4_ = uVar19;
        auVar31 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar14 + -0x50 + uVar15 * 4)));
        auVar24 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar14 + -0x40 + uVar15 * 4)));
        auVar27 = vsubps_avx512vl(auVar40,auVar51);
        auVar28 = vsubps_avx512vl(auVar31,auVar53);
        auVar32 = vsubps_avx512vl(auVar24,auVar54);
        auVar33 = vsubps_avx512vl(auVar46,auVar40);
        auVar34 = vsubps_avx512vl(auVar48,auVar31);
        auVar36 = vsubps_avx512vl(auVar50,auVar24);
        auVar30 = vmulps_avx512vl(auVar28,auVar36);
        auVar37 = vfmsub231ps_avx512vl(auVar30,auVar34,auVar32);
        auVar30 = vmulps_avx512vl(auVar32,auVar33);
        auVar38 = vfmsub231ps_avx512vl(auVar30,auVar36,auVar27);
        auVar30 = vmulps_avx512vl(auVar27,auVar34);
        auVar39 = vfmsub231ps_avx512vl(auVar30,auVar33,auVar28);
        auVar30 = vsubps_avx(auVar40,*(undefined1 (*) [16])ray);
        auVar40 = vsubps_avx512vl(auVar31,*(undefined1 (*) [16])(ray + 0x10));
        auVar24 = vsubps_avx512vl(auVar24,*(undefined1 (*) [16])(ray + 0x20));
        auVar31 = vmulps_avx512vl(auVar26,auVar24);
        auVar41 = vfmsub231ps_avx512vl(auVar31,auVar40,auVar29);
        auVar31 = vmulps_avx512vl(auVar29,auVar30);
        auVar42 = vfmsub231ps_avx512vl(auVar31,auVar24,auVar25);
        auVar31 = vmulps_avx512vl(auVar25,auVar40);
        auVar43 = vfmsub231ps_avx512vl(auVar31,auVar30,auVar26);
        auVar52._0_4_ = auVar39._0_4_ * auVar29._0_4_;
        auVar52._4_4_ = auVar39._4_4_ * auVar29._4_4_;
        auVar52._8_4_ = auVar39._8_4_ * auVar29._8_4_;
        auVar52._12_4_ = auVar39._12_4_ * auVar29._12_4_;
        auVar31 = vfmadd231ps_fma(auVar52,auVar38,auVar26);
        auVar31 = vfmadd231ps_fma(auVar31,auVar37,auVar25);
        auVar35._8_4_ = 0x80000000;
        auVar35._0_8_ = 0x8000000080000000;
        auVar35._12_4_ = 0x80000000;
        auVar35 = vandps_avx512vl(auVar31,auVar35);
        auVar36 = vmulps_avx512vl(auVar36,auVar43);
        auVar34 = vfmadd231ps_avx512vl(auVar36,auVar42,auVar34);
        auVar33 = vfmadd231ps_avx512vl(auVar34,auVar41,auVar33);
        auVar33 = vxorps_avx512vl(auVar35,auVar33);
        uVar5 = vcmpps_avx512vl(auVar33,_DAT_01feba10,5);
        bVar16 = (byte)uVar5 & bVar7;
        if (bVar16 != 0) {
          auVar32 = vmulps_avx512vl(auVar32,auVar43);
          auVar28 = vfmadd213ps_avx512vl(auVar28,auVar42,auVar32);
          auVar27 = vfmadd213ps_avx512vl(auVar27,auVar41,auVar28);
          auVar27 = vxorps_avx512vl(auVar35,auVar27);
          uVar5 = vcmpps_avx512vl(auVar27,_DAT_01feba10,5);
          bVar16 = bVar16 & (byte)uVar5;
          if (bVar16 != 0) {
            auVar36._8_4_ = 0x7fffffff;
            auVar36._0_8_ = 0x7fffffff7fffffff;
            auVar36._12_4_ = 0x7fffffff;
            auVar28 = vandps_avx512vl(auVar31,auVar36);
            auVar32 = vsubps_avx512vl(auVar28,auVar33);
            uVar5 = vcmpps_avx512vl(auVar32,auVar27,5);
            bVar16 = bVar16 & (byte)uVar5;
            if (bVar16 != 0) {
              auVar24 = vmulps_avx512vl(auVar39,auVar24);
              auVar24 = vfmadd213ps_fma(auVar40,auVar38,auVar24);
              auVar30 = vfmadd213ps_fma(auVar30,auVar37,auVar24);
              auVar30 = vxorps_avx512vl(auVar35,auVar30);
              auVar24 = vmulps_avx512vl(auVar28,*(undefined1 (*) [16])(ray + 0x30));
              auVar27 = vmulps_avx512vl(auVar28,*(undefined1 (*) [16])(ray + 0x80));
              uVar5 = vcmpps_avx512vl(auVar30,auVar27,2);
              uVar6 = vcmpps_avx512vl(auVar24,auVar30,1);
              bVar16 = bVar16 & (byte)uVar5 & (byte)uVar6;
              if (bVar16 != 0) {
                uVar5 = vcmpps_avx512vl(auVar31,_DAT_01feba10,4);
                bVar16 = bVar16 & (byte)uVar5;
                if (bVar16 != 0) {
                  uVar1 = ((context->scene->geometries).items[uVar23].ptr)->mask;
                  auVar37._4_4_ = uVar1;
                  auVar37._0_4_ = uVar1;
                  auVar37._8_4_ = uVar1;
                  auVar37._12_4_ = uVar1;
                  uVar5 = vptestmd_avx512vl(*(undefined1 (*) [16])(ray + 0x90),auVar37);
                  bVar16 = bVar16 & (byte)uVar5 & 0xf;
                  if (bVar16 != 0) {
                    uVar17 = (ushort)((bVar16 ^ 0xf) & bVar7);
                  }
                }
              }
            }
          }
        }
        bVar21 = (char)uVar17 != '\0';
      }
      bVar7 = (byte)uVar17;
      auVar47 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
      if ((!bVar21) || (bVar21 = 2 < uVar15, uVar15 = uVar15 + 1, bVar21)) break;
    }
    bVar7 = (byte)uVar9 & bVar7;
    uVar9 = (ushort)bVar7;
    if (bVar7 == 0) break;
  }
  bVar7 = bVar7 ^ 0xf;
LAB_0073c1a7:
  bVar7 = (byte)uVar11 | bVar7;
  uVar11 = (ushort)bVar7;
  if (bVar7 == 0xf) {
LAB_0073c1b4:
    iVar10 = 3;
  }
  else {
    auVar26 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    aVar44._0_4_ = (uint)(bVar7 & 1) * auVar26._0_4_ |
                   (uint)!(bool)(bVar7 & 1) * tray.tfar.field_0._0_4_;
    bVar21 = (bool)(bVar7 >> 1 & 1);
    aVar44._4_4_ = (uint)bVar21 * auVar26._4_4_ | (uint)!bVar21 * tray.tfar.field_0._4_4_;
    bVar21 = (bool)(bVar7 >> 2 & 1);
    aVar44._8_4_ = (uint)bVar21 * auVar26._8_4_ | (uint)!bVar21 * tray.tfar.field_0._8_4_;
    bVar21 = (bool)(bVar7 >> 3 & 1);
    aVar44._12_4_ = (uint)bVar21 * auVar26._12_4_ | (uint)!bVar21 * tray.tfar.field_0._12_4_;
    iVar10 = 0;
    tray.tfar.field_0 = aVar44;
  }
LAB_0073c1d5:
  if (iVar10 == 3) {
    bVar8 = (byte)uVar11 & bVar8;
    bVar21 = (bool)(bVar8 >> 1 & 1);
    bVar2 = (bool)(bVar8 >> 2 & 1);
    *(uint *)(ray + 0x80) =
         (uint)(bVar8 & 1) * -0x800000 | (uint)!(bool)(bVar8 & 1) * *(int *)(ray + 0x80);
    *(uint *)(ray + 0x84) = (uint)bVar21 * -0x800000 | (uint)!bVar21 * *(int *)(ray + 0x84);
    *(uint *)(ray + 0x88) = (uint)bVar2 * -0x800000 | (uint)!bVar2 * *(int *)(ray + 0x88);
    *(uint *)(ray + 0x8c) =
         (uint)(bVar8 >> 3) * -0x800000 | (uint)!(bool)(bVar8 >> 3) * *(int *)(ray + 0x8c);
    return;
  }
  goto LAB_0073bac1;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }